

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int nh_http_parse_consume_body(http_context_t *ctx)

{
  uint uVar1;
  nh_stream_t *stream;
  uint32_t length;
  http_context_t *ctx_local;
  
  uVar1 = ctx->body_len;
  if ((ctx->body).index == 0) {
    (ctx->body).index = (ctx->raw).index;
  }
  if (uVar1 < (ctx->raw).length - (ctx->body).index) {
    (ctx->body).len = uVar1;
  }
  else if ((ctx->body).len < uVar1) {
    (ctx->body).len = (ctx->raw).length - (ctx->body).index;
  }
  (ctx->raw).index = (ctx->body).index + (ctx->body).len;
  return (int)((ctx->body).len == uVar1);
}

Assistant:

int nh_http_parse_consume_body(http_context_t *ctx) {
    uint32_t length = ctx->body_len;
    nh_stream_t *stream = &ctx->raw;
    if (ctx->body.index == 0) ctx->body.index = stream->index;
    if (stream->length - ctx->body.index > length) {
        ctx->body.len = length;
    } else if (ctx->body.len < length) {
        ctx->body.len = stream->length - ctx->body.index;
    }
    stream->index = ctx->body.index + ctx->body.len;
    return ctx->body.len == length;
}